

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_util.c
# Opt level: O2

void dec_derive_skip_mv_affine(com_core_t *core,int mrg_idx)

{
  pthread_mutex_t *ppVar1;
  com_scu_t cVar2;
  char cVar3;
  int iVar4;
  com_seqh_t *pcVar5;
  s8 (*pasVar6) [2];
  com_scu_t *pcVar7;
  com_pic_t *pcVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  CPMV (*paaCVar21) [4] [2];
  byte bVar22;
  byte bVar23;
  uint uVar24;
  int iVar25;
  ulong uVar26;
  ulong uVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  CPMV (*paaCVar31) [4] [2];
  s16 (*paasVar32) [2] [2];
  short sVar33;
  int iVar34;
  short sVar35;
  int iVar36;
  ulong uVar37;
  int *piVar38;
  int iVar39;
  int iVar40;
  CPMV CVar41;
  int iVar42;
  CPMV *pCVar43;
  uint uVar44;
  uint uVar45;
  int iVar46;
  uint uVar47;
  int iVar48;
  undefined4 *puVar49;
  undefined4 uVar50;
  int iVar51;
  int *piVar52;
  uint unaff_R15D;
  int iVar53;
  int iVar54;
  bool bVar55;
  s8 mrg_list_refi [2];
  int local_208;
  undefined4 local_1f8;
  undefined4 local_1f4;
  undefined4 local_1f0;
  uint local_1ec;
  int top_left [5];
  int valid_model [2];
  int valid [5];
  int neb_addr_lt [3];
  int local_120;
  s16 local_11c [2];
  int neighbor [5];
  int iStack_104;
  undefined8 auStack_100 [6];
  long local_d0;
  long local_c8;
  u32 *local_c0;
  int neb_addr_rt [2];
  CPMV mrg_list_cp_mv [2] [4] [2];
  
  iVar36 = core->cu_scup;
  pcVar5 = core->seqhdr;
  iVar17 = pcVar5->log2_max_cuwh;
  iVar18 = pcVar5->i_scu;
  local_c8 = (long)core->cu_width;
  iVar28 = core->cu_width >> 2;
  local_d0 = (long)core->cu_height;
  pasVar6 = (core->map).map_refi;
  paasVar32 = (core->map).map_mv;
  pcVar7 = (core->map).map_scu;
  local_c0 = (core->map).map_pos;
  iVar12 = ((core->cu_height >> 2) + -1) * iVar18 + iVar36 + -1;
  neighbor[0] = iVar12;
  iVar39 = iVar36 - iVar18;
  iVar13 = iVar28 + iVar39 + -1;
  neighbor[1] = iVar13;
  neighbor[2] = iVar28 + iVar39;
  neighbor[3] = iVar36 + -1;
  neighbor[4] = iVar39 + -1;
  for (lVar19 = 0; iVar4 = valid[3], lVar19 != 5; lVar19 = lVar19 + 1) {
    cVar2 = pcVar7[neighbor[lVar19]];
    valid[lVar19] = (byte)cVar2 >> 5 & 3;
    if (((byte)cVar2 >> 5 & 3) != 0) {
      top_left[lVar19] = local_c0[neighbor[lVar19]] >> 6;
    }
  }
  iVar14 = mrg_idx + 1;
  iVar29 = 2;
  if (iVar14 < 2) {
    iVar29 = iVar14;
  }
  if ((valid[1] != 0 && valid[2] != 0) && (top_left[1] == top_left[2])) {
    valid[2] = 0;
  }
  if (((valid[3] != 0) && (valid[0] != 0)) && (top_left[0] == top_left[3])) {
    valid[3] = 0;
  }
  if (((valid[4] != 0 && iVar4 != 0) && (top_left[4] == top_left[3])) ||
     ((valid[1] != 0 && valid[4] != 0 && (top_left[4] == top_left[1])))) {
    valid[4] = 0;
  }
  uVar26 = 0;
  local_208 = 0;
  while( true ) {
    uVar50 = 1;
    if ((4 < uVar26) || (iVar29 <= local_208)) break;
    if (valid[uVar26] != 0) {
      if (local_208 == mrg_idx) {
        iVar4 = neighbor[uVar26];
        unaff_R15D = ((byte)pcVar7[iVar4] & 0x60) == 0x20 ^ 3;
        for (lVar19 = 0; lVar19 != 2; lVar19 = lVar19 + 1) {
          cVar3 = pasVar6[iVar4][lVar19];
          mrg_list_refi[lVar19] = cVar3;
          if (-1 < cVar3) {
            uVar15 = local_c0[iVar4];
            bVar22 = (byte)uVar15 & 7;
            bVar23 = (byte)(uVar15 >> 3) & 7;
            uVar44 = 1 << bVar23;
            uVar15 = uVar15 >> 6;
            neb_addr_lt[0] = uVar15;
            neb_addr_lt[1] = ((uint)(1 << bVar22) >> 2) + uVar15 + -1;
            neb_addr_lt[2] = ((uVar44 >> 2) - 1) * iVar18 + uVar15;
            iVar34 = (int)((long)(ulong)uVar15 / (long)iVar18);
            for (lVar20 = 0; lVar20 != 4; lVar20 = lVar20 + 1) {
              *(s16 (*) [2])(&local_1f8 + lVar20) = paasVar32[neb_addr_lt[lVar20]][lVar19];
            }
            uVar47 = (iVar36 / iVar18) * 4;
            uVar44 = uVar44 + iVar34 * 4;
            bVar55 = (uVar44 & ~(-1 << ((byte)iVar17 & 0x1f))) == 0;
            bVar9 = uVar44 != uVar47;
            bVar10 = !bVar55;
            if (uVar44 == uVar47 && bVar55) {
              sVar33 = (short)(local_1ec >> 0x10);
              uVar44 = uVar47;
              uVar24 = local_1f0;
              uVar45 = local_1ec;
              sVar35 = local_1f0._2_2_;
            }
            else {
              uVar44 = iVar34 << 2;
              uVar24 = local_1f8 & 0xffff;
              uVar45 = local_1f4 & 0xffff;
              sVar33 = local_1f4._2_2_;
              sVar35 = local_1f8._2_2_;
            }
            bVar22 = bVar22 ^ 7;
            iVar51 = (int)(short)uVar24;
            iVar46 = (short)uVar45 - iVar51 << bVar22;
            iVar53 = (int)sVar35;
            iVar34 = sVar33 - iVar53 << bVar22;
            bVar55 = unaff_R15D == 3;
            if (bVar55 && (bVar9 || bVar10)) {
              bVar23 = bVar23 ^ 7;
              iVar40 = (short)local_1f0 - iVar51 << bVar23;
              unaff_R15D = 3;
              iVar11 = local_1f0._2_2_ - iVar53 << bVar23;
            }
            else {
              iVar40 = -iVar34;
              unaff_R15D = 2;
              iVar11 = iVar46;
            }
            iVar30 = (iVar36 % iVar18 - (int)((long)(ulong)uVar15 % (long)iVar18)) * 4;
            iVar48 = uVar47 - uVar44;
            iVar16 = iVar46 * iVar30 + iVar51 * 0x80;
            iVar54 = 0;
            iVar25 = 0;
            uVar44 = iVar40 * iVar48 + iVar16;
            if (uVar44 != 0) {
              uVar15 = (int)uVar44 >> 0x1f;
              iVar25 = (((int)(((uVar44 ^ uVar15) - uVar15) + 0x40) >> 7 ^ uVar15) - uVar15) * 4;
            }
            iVar42 = iVar34 * iVar30 + iVar53 * 0x80;
            uVar44 = iVar11 * iVar48 + iVar42;
            if (uVar44 != 0) {
              uVar15 = (int)uVar44 >> 0x1f;
              iVar54 = (((int)(((uVar44 ^ uVar15) - uVar15) + 0x40) >> 7 ^ uVar15) - uVar15) * 4;
            }
            if (0x1fffe < iVar25) {
              iVar25 = 0x1ffff;
            }
            if (iVar25 < -0x1ffff) {
              iVar25 = -0x20000;
            }
            if (0x1fffe < iVar54) {
              iVar54 = 0x1ffff;
            }
            if (iVar54 < -0x1ffff) {
              iVar54 = -0x20000;
            }
            mrg_list_cp_mv[lVar19][0][0] = iVar25;
            mrg_list_cp_mv[lVar19][0][1] = iVar54;
            iVar25 = 0;
            iVar54 = 0;
            uVar44 = iVar46 * (iVar30 + (int)local_c8) + iVar51 * 0x80 + iVar40 * iVar48;
            if (uVar44 != 0) {
              uVar15 = (int)uVar44 >> 0x1f;
              iVar54 = (((int)(((uVar44 ^ uVar15) - uVar15) + 0x40) >> 7 ^ uVar15) - uVar15) * 4;
            }
            uVar44 = iVar34 * (iVar30 + (int)local_c8) + iVar53 * 0x80 + iVar11 * iVar48;
            if (uVar44 != 0) {
              uVar15 = (int)uVar44 >> 0x1f;
              iVar25 = (((int)(((uVar44 ^ uVar15) - uVar15) + 0x40) >> 7 ^ uVar15) - uVar15) * 4;
            }
            if (0x1fffe < iVar54) {
              iVar54 = 0x1ffff;
            }
            if (iVar54 < -0x1ffff) {
              iVar54 = -0x20000;
            }
            mrg_list_cp_mv[lVar19][1][0] = iVar54;
            if (0x1fffe < iVar25) {
              iVar25 = 0x1ffff;
            }
            if (iVar25 < -0x1ffff) {
              iVar25 = -0x20000;
            }
            mrg_list_cp_mv[lVar19][1][1] = iVar25;
            if (bVar55 && (bVar9 || bVar10)) {
              iVar46 = 0;
              iVar34 = 0;
              uVar44 = iVar40 * (iVar48 + (int)local_d0) + iVar16;
              if (uVar44 != 0) {
                uVar15 = (int)uVar44 >> 0x1f;
                iVar34 = (((int)(((uVar44 ^ uVar15) - uVar15) + 0x40) >> 7 ^ uVar15) - uVar15) * 4;
              }
              uVar44 = iVar11 * (iVar48 + (int)local_d0) + iVar42;
              if (uVar44 != 0) {
                uVar15 = (int)uVar44 >> 0x1f;
                iVar46 = (((int)(((uVar44 ^ uVar15) - uVar15) + 0x40) >> 7 ^ uVar15) - uVar15) * 4;
              }
              if (0x1fffe < iVar34) {
                iVar34 = 0x1ffff;
              }
              if (iVar34 < -0x1ffff) {
                iVar34 = -0x20000;
              }
              mrg_list_cp_mv[lVar19][2][0] = iVar34;
              if (0x1fffe < iVar46) {
                iVar46 = 0x1ffff;
              }
              if (iVar46 < -0x1ffff) {
                iVar46 = -0x20000;
              }
              mrg_list_cp_mv[lVar19][2][1] = iVar46;
            }
          }
        }
      }
      local_208 = local_208 + 1;
    }
    uVar26 = uVar26 + 1;
  }
  if (mrg_idx < local_208) goto LAB_00108d27;
  for (lVar19 = 0; lVar19 != 4; lVar19 = lVar19 + 1) {
    top_left[lVar19] = -1;
    top_left[lVar19 + 4] = -1;
    (&local_1f8)[lVar19] = 0;
  }
  iVar17 = 5;
  if (iVar14 < 5) {
    iVar17 = iVar14;
  }
  neb_addr_lt[0] = iVar36 + -1;
  neb_addr_lt[1] = iVar39;
  neb_addr_lt[2] = iVar39 + -1;
  lVar19 = 0;
  do {
    if (lVar19 == 3) goto LAB_00108e7c;
    iVar36 = neb_addr_lt[lVar19];
    lVar19 = lVar19 + 1;
  } while (((byte)pcVar7[iVar36] & 4) == 0);
  top_left[0] = (int)pasVar6[iVar36][0];
  valid[0] = (int)paasVar32[iVar36][0];
  top_left[4] = (int)pasVar6[iVar36][1];
  valid[4] = (int)paasVar32[iVar36][1];
  local_1f8 = 1;
LAB_00108e7c:
  neb_addr_rt[0] = iVar13;
  neb_addr_rt[1] = iVar28 + iVar39;
  lVar19 = 0;
  do {
    if (lVar19 == 2) goto LAB_00108eec;
    iVar36 = neb_addr_rt[lVar19];
    lVar19 = lVar19 + 1;
  } while (((byte)pcVar7[iVar36] & 4) == 0);
  top_left[1] = (int)pasVar6[iVar36][0];
  valid[1] = (int)paasVar32[iVar36][0];
  local_1f4 = 1;
LAB_00108eec:
  if (((byte)pcVar7[iVar12] & 4) != 0) {
    top_left[2] = (int)pasVar6[iVar12][0];
    valid[2] = (int)paasVar32[iVar12][0];
    local_1f0 = 1;
  }
  uVar44 = (iVar12 + iVar28) % iVar18 & 0xfffffffc;
  uVar15 = (iVar12 + iVar28) / iVar18 & 0xfffffffc;
  iVar36 = uVar15 + 2;
  iVar12 = (int)(uVar15 + pcVar5->pic_height_in_scu) >> 1;
  if (iVar36 < pcVar5->pic_height_in_scu) {
    iVar12 = iVar36;
  }
  iVar36 = uVar44 + 2;
  iVar13 = (int)(uVar44 + pcVar5->pic_width_in_scu) >> 1;
  if (iVar36 < pcVar5->pic_width_in_scu) {
    iVar13 = iVar36;
  }
  iVar13 = iVar18 * iVar12 + iVar13;
  if (core->pichdr->slice_type == '\x03') {
    pcVar8 = core->refp[0][1].pic;
    if (SBORROW4(pcVar8->finished_line,iVar12 * 4) != pcVar8->finished_line + iVar12 * -4 < 0) {
      ppVar1 = &pcVar8->mutex;
      pthread_mutex_lock((pthread_mutex_t *)ppVar1);
      while (SBORROW4(pcVar8->finished_line,iVar12 * 4) != pcVar8->finished_line + iVar12 * -4 < 0)
      {
        pthread_cond_wait((pthread_cond_t *)&pcVar8->cond,(pthread_mutex_t *)ppVar1);
      }
      pthread_mutex_unlock((pthread_mutex_t *)ppVar1);
    }
    lVar19 = (long)core->refp[0][1].map_refi[iVar13][0];
    if (lVar19 < 0) {
LAB_0010912a:
      uVar50 = 0;
    }
    else {
      iVar36 = (int)(core->refp[0][1].pic)->list_dist[lVar19];
      paasVar32 = core->refp[0][1].map_mv + iVar13;
      scaling_mv((int)core->refp[0][0].dist,iVar36,(s16 *)paasVar32,(s16 *)&local_120);
      scaling_mv((int)core->refp[0][1].dist,iVar36,(s16 *)paasVar32,local_11c);
      for (lVar19 = 0; uVar50 = 1, lVar19 != 8; lVar19 = lVar19 + 4) {
        top_left[lVar19 + 3] = 0;
        valid[lVar19 + 3] = *(int *)((long)local_11c + lVar19 + -4);
      }
    }
  }
  else {
    pcVar8 = core->refp[0][0].pic;
    if (pcVar8->finished_line < iVar12 * 4) {
      ppVar1 = &pcVar8->mutex;
      pthread_mutex_lock((pthread_mutex_t *)ppVar1);
      while (pcVar8->finished_line < iVar12 * 4) {
        pthread_cond_wait((pthread_cond_t *)&pcVar8->cond,(pthread_mutex_t *)ppVar1);
      }
      pthread_mutex_unlock((pthread_mutex_t *)ppVar1);
    }
    lVar19 = (long)core->refp[0][0].map_refi[iVar13][0];
    if (lVar19 < 0) goto LAB_0010912a;
    scaling_mv((int)core->refp[0][0].dist,(int)(core->refp[0][0].pic)->list_dist[lVar19],
               (s16 *)(core->refp[0][0].map_mv + iVar13),(s16 *)&local_120);
    top_left[3] = 0;
    valid[3] = local_120;
  }
  local_1ec = uVar50;
  puVar49 = &DAT_00159970;
  uVar26 = 0;
  while ((uVar26 < 6 && (local_208 < iVar17))) {
    piVar52 = &DAT_00159970 + uVar26 * 4;
    uVar44 = (&get_affine_merge_candidate_cp_num)[uVar26];
    valid_model[0] = 0;
    valid_model[1] = 0;
    if (uVar44 == 3) {
      iVar36 = *piVar52;
      if ((((&local_1f8)[iVar36] != 0) &&
          (iVar18 = (&DAT_00159974)[uVar26 * 4], (&local_1f8)[iVar18] != 0)) &&
         (iVar12 = (&DAT_00159978)[uVar26 * 4], (&local_1f8)[iVar12] != 0)) {
        for (lVar19 = 0; lVar19 != 8; lVar19 = lVar19 + 4) {
          iVar13 = top_left[iVar36 + lVar19];
          if (((-1 < iVar13) && (-1 < top_left[iVar18 + lVar19])) &&
             ((iVar13 == top_left[iVar12 + lVar19] &&
              ((iVar13 == top_left[iVar18 + lVar19] && (-1 < top_left[iVar12 + lVar19])))))) {
            *(undefined4 *)((long)valid_model + lVar19) = 1;
          }
        }
        goto LAB_0010926c;
      }
    }
    else {
      if (uVar44 == 2) {
        iVar36 = *piVar52;
        if (((&local_1f8)[iVar36] == 0) ||
           (iVar18 = (&DAT_00159974)[uVar26 * 4], (&local_1f8)[iVar18] == 0)) goto LAB_0010952d;
        for (lVar19 = 0; lVar19 != 8; lVar19 = lVar19 + 4) {
          if ((-1 < top_left[iVar36 + lVar19]) &&
             (top_left[iVar36 + lVar19] == top_left[iVar18 + lVar19])) {
            *(undefined4 *)((long)valid_model + lVar19) = 1;
          }
        }
      }
LAB_0010926c:
      if (valid_model[1] != 0 || valid_model[0] != 0) {
        if (local_208 == mrg_idx) {
          uVar27 = 0;
          if (0 < (int)uVar44) {
            uVar27 = (ulong)uVar44;
          }
          piVar38 = neighbor + 1;
          pCVar43 = mrg_list_cp_mv[0][0] + 1;
          for (lVar19 = 0; lVar19 != 2; lVar19 = lVar19 + 1) {
            if (valid_model[lVar19] == 0) {
              mrg_list_refi[lVar19] = -1;
            }
            else {
              for (uVar37 = 0; uVar27 != uVar37; uVar37 = uVar37 + 1) {
                lVar20 = (long)(int)puVar49[uVar37];
                neighbor[lVar19 * 8 + lVar20 * 2] = (int)(short)valid[lVar19 * 4 + lVar20];
                neighbor[lVar19 * 8 + lVar20 * 2 + 1] =
                     (int)*(short *)((long)valid + lVar20 * 4 + lVar19 * 0x10 + 2);
              }
              switch((int)uVar26) {
              case 1:
                *(ulong *)(neighbor + lVar19 * 8 + 4) =
                     CONCAT44(((int)((ulong)*(undefined8 *)(neighbor + lVar19 * 8) >> 0x20) +
                              (int)((ulong)auStack_100[lVar19 * 4] >> 0x20)) -
                              (int)((ulong)*(undefined8 *)(neighbor + lVar19 * 8 + 2) >> 0x20),
                              ((int)*(undefined8 *)(neighbor + lVar19 * 8) +
                              (int)auStack_100[lVar19 * 4]) -
                              (int)*(undefined8 *)(neighbor + lVar19 * 8 + 2));
                break;
              case 2:
                *(ulong *)(neighbor + lVar19 * 8 + 2) =
                     CONCAT44(((int)((ulong)*(undefined8 *)(neighbor + lVar19 * 8) >> 0x20) +
                              (int)((ulong)auStack_100[lVar19 * 4] >> 0x20)) -
                              (int)((ulong)*(undefined8 *)(neighbor + lVar19 * 8 + 4) >> 0x20),
                              ((int)*(undefined8 *)(neighbor + lVar19 * 8) +
                              (int)auStack_100[lVar19 * 4]) -
                              (int)*(undefined8 *)(neighbor + lVar19 * 8 + 4));
                break;
              case 3:
                *(ulong *)(neighbor + lVar19 * 8) =
                     CONCAT44(((int)((ulong)*(undefined8 *)(neighbor + lVar19 * 8 + 4) >> 0x20) +
                              (int)((ulong)*(undefined8 *)(neighbor + lVar19 * 8 + 2) >> 0x20)) -
                              (int)((ulong)auStack_100[lVar19 * 4] >> 0x20),
                              ((int)*(undefined8 *)(neighbor + lVar19 * 8 + 4) +
                              (int)*(undefined8 *)(neighbor + lVar19 * 8 + 2)) -
                              (int)auStack_100[lVar19 * 4]);
                break;
              case 5:
                bVar22 = (g_tbl_log2[local_c8] - g_tbl_log2[local_d0]) + 7;
                iVar36 = neighbor[lVar19 * 8];
                iVar12 = 0;
                iVar18 = 0;
                uVar15 = iVar36 * 0x80 +
                         ((&iStack_104)[lVar19 * 8] - neighbor[lVar19 * 8 + 1] << (bVar22 & 0x1f));
                if (uVar15 != 0) {
                  uVar47 = (int)uVar15 >> 0x1f;
                  iVar18 = ((int)(((uVar15 ^ uVar47) - uVar47) + 0x40) >> 7 ^ uVar47) - uVar47;
                }
                neighbor[lVar19 * 8 + 2] = iVar18;
                uVar15 = (iVar36 - neighbor[lVar19 * 8 + 4] << (bVar22 & 0x1f)) +
                         neighbor[lVar19 * 8 + 1] * 0x80;
                if (uVar15 != 0) {
                  uVar47 = (int)uVar15 >> 0x1f;
                  iVar12 = ((int)(((uVar15 ^ uVar47) - uVar47) + 0x40) >> 7 ^ uVar47) - uVar47;
                }
                neighbor[lVar19 * 8 + 3] = iVar12;
              }
              mrg_list_refi[lVar19] = (s8)top_left[lVar19 * 4 + (long)*piVar52];
              for (uVar37 = 0; uVar27 != uVar37; uVar37 = uVar37 + 1) {
                iVar36 = piVar38[uVar37 * 2];
                iVar18 = piVar38[uVar37 * 2 + -1] << 2;
                piVar38[uVar37 * 2 + -1] = iVar18;
                CVar41 = iVar36 << 2;
                piVar38[uVar37 * 2] = CVar41;
                if (0x1fffe < iVar18) {
                  iVar18 = 0x1ffff;
                }
                if (iVar18 < -0x1ffff) {
                  iVar18 = -0x20000;
                }
                pCVar43[uVar37 * 2 + -1] = iVar18;
                if (0x1fffe < CVar41) {
                  CVar41 = 0x1ffff;
                }
                if (CVar41 < -0x1ffff) {
                  CVar41 = -0x20000;
                }
                pCVar43[uVar37 * 2] = CVar41;
              }
            }
            pCVar43 = pCVar43 + 8;
            piVar38 = piVar38 + 8;
          }
        }
        local_208 = local_208 + 1;
        unaff_R15D = uVar44;
      }
    }
LAB_0010952d:
    uVar26 = uVar26 + 1;
    puVar49 = puVar49 + 4;
  }
LAB_00108d27:
  if (local_208 <= mrg_idx) {
    mrg_list_refi[0] = '\0';
    mrg_list_refi[1] = -1;
    mrg_list_cp_mv[0][0][0] = 0;
    mrg_list_cp_mv[0][0][1] = 0;
    mrg_list_cp_mv[0][1][0] = 0;
    mrg_list_cp_mv[0][1][1] = 0;
    mrg_list_cp_mv[0][2][0] = 0;
    mrg_list_cp_mv[0][2][1] = 0;
    mrg_list_cp_mv[0][3][0] = 0;
    mrg_list_cp_mv[0][3][1] = 0;
    mrg_list_cp_mv[1][0][0] = 0;
    mrg_list_cp_mv[1][0][1] = 0;
    mrg_list_cp_mv[1][1][0] = 0;
    mrg_list_cp_mv[1][1][1] = 0;
    mrg_list_cp_mv[1][2][0] = 0;
    mrg_list_cp_mv[1][2][1] = 0;
    mrg_list_cp_mv[1][3][0] = 0;
    mrg_list_cp_mv[1][3][1] = 0;
    unaff_R15D = 2;
  }
  core->affine_flag = (char)unaff_R15D + 0xff;
  paaCVar21 = core->affine_mv;
  uVar27 = 0;
  uVar26 = (ulong)unaff_R15D;
  if ((int)unaff_R15D < 1) {
    uVar26 = uVar27;
  }
  paaCVar31 = mrg_list_cp_mv;
  for (; uVar27 != 2; uVar27 = uVar27 + 1) {
    if (mrg_list_refi[uVar27] < '\0') {
      core->refi[uVar27] = -1;
    }
    else {
      core->refi[uVar27] = mrg_list_refi[uVar27];
      for (uVar37 = 0; uVar26 != uVar37; uVar37 = uVar37 + 1) {
        (*paaCVar21)[uVar37] = (*paaCVar31)[uVar37];
      }
    }
    paaCVar21 = paaCVar21 + 1;
    paaCVar31 = paaCVar31 + 1;
  }
  return;
}

Assistant:

void dec_derive_skip_mv_affine(com_core_t * core, int mrg_idx)
{
    s8  mrg_list_refi  [REFP_NUM];
    int mrg_list_cp_num;
    CPMV mrg_list_cp_mv[REFP_NUM][VER_NUM][MV_D];
    int cp_idx, lidx;

    get_affine_merge_candidate(core, mrg_list_refi, mrg_list_cp_mv, &mrg_list_cp_num, mrg_idx);
    
    core->affine_flag = mrg_list_cp_num - 1;

    for (lidx = 0; lidx < REFP_NUM; lidx++) {
        if (REFI_IS_VALID(mrg_list_refi[lidx])) {
            core->refi[lidx] = mrg_list_refi[lidx];
            for (cp_idx = 0; cp_idx < mrg_list_cp_num; cp_idx++) {
                CP64(core->affine_mv[lidx][cp_idx], mrg_list_cp_mv[lidx][cp_idx]);
            }
        } else {
            core->refi[lidx] = REFI_INVALID;
        }
    }
}